

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetHoveredID(ImGuiID id)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  GImGui->HoveredId = id;
  pIVar1->HoveredIdAllowOverlap = false;
  pIVar1->HoveredIdUsingMouseWheel = false;
  if ((id != 0) && (pIVar1->HoveredIdPreviousFrame != id)) {
    pIVar1->HoveredIdTimer = 0.0;
    pIVar1->HoveredIdNotActiveTimer = 0.0;
  }
  return;
}

Assistant:

void ImGui::SetHoveredID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    g.HoveredId = id;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    if (id != 0 && g.HoveredIdPreviousFrame != id)
        g.HoveredIdTimer = g.HoveredIdNotActiveTimer = 0.0f;
}